

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O0

void deserialize_negative_container_count(void)

{
  roaring_bitmap_t *file;
  unsigned_long unaff_retaddr;
  roaring_bitmap_t *bitmap;
  uint8_t data [8];
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  char *expression;
  
  expression = (char *)0x800000000000303a;
  roaring_bitmap_portable_deserialize_size
            (in_stack_fffffffffffffff0,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
            );
  _assert_int_equal(unaff_retaddr,(unsigned_long)expression,in_stack_fffffffffffffff0,
                    in_stack_ffffffffffffffec);
  file = roaring_bitmap_portable_deserialize_safe((char *)bitmap,unaff_retaddr);
  _assert_true(unaff_retaddr,expression,(char *)file,in_stack_ffffffffffffffec);
  return;
}

Assistant:

DEFINE_TEST(deserialize_negative_container_count) {
    // clang-format off
    const uint8_t data[] = {
        0x3A, 0x30, 0, 0,       // Serial Cookie No Run Container
        0x00, 0x00, 0x00, 0x80, // Container count (NEGATIVE)
    };
    // clang-format on
    assert_int_equal(roaring_bitmap_portable_deserialize_size((const char*)data,
                                                              sizeof(data)),
                     0);
    roaring_bitmap_t* bitmap = roaring_bitmap_portable_deserialize_safe(
        (const char*)data, sizeof(data));
    assert_null(bitmap);
}